

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaOverlay.cpp
# Opt level: O2

string * numberInputTitle<double>
                   (string *__return_storage_ptr__,string *keyName,double minimum,double maximum,
                   function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(double)>
                   *formatter)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (((minimum == 2.2250738585072014e-308) && (!NAN(minimum))) ||
     ((maximum == 1.79769313486232e+308 && (!NAN(maximum))))) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)keyName);
  }
  else {
    std::operator+(&local_90,keyName," (");
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(double)>
    ::operator()(&local_b0,formatter,minimum);
    std::operator+(&local_70,&local_90,&local_b0);
    std::operator+(&local_50,&local_70," - ");
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(double)>
    ::operator()(&local_d0,formatter,maximum);
    std::operator+(&local_30,&local_50,&local_d0);
    std::operator+(__return_storage_ptr__,&local_30,")");
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string numberInputTitle(
    std::string keyName,
    T minimum,
    T maximum,
    std::function<std::string(T)> formatter)
{
    if (NumberValidator<T>::bounded(minimum, maximum)) {
        return keyName + " (" + formatter(minimum)
            + " - " + formatter(maximum) + ")";
    }
    return keyName;
}